

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::PipelineCache>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  int *piVar1;
  long *plVar2;
  undefined8 uVar3;
  pointer pSVar4;
  deUint32 dVar5;
  void *pvVar6;
  long *plVar7;
  ThreadGroupThread *this;
  uint uVar8;
  allocator_type *__a;
  size_type __n;
  long lVar9;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  resources;
  ThreadGroup threads;
  Environment env;
  undefined1 local_c1;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_c0;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  local_b0;
  ThreadGroup local_98;
  PlatformInterface *local_68;
  DeviceInterface *local_60;
  VkDevice local_58;
  deUint32 local_50;
  ProgramCollection<vk::ProgramBinary> *local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  dVar5 = deGetNumAvailableLogicalCores();
  uVar8 = 8;
  if (dVar5 < 8) {
    uVar8 = dVar5;
  }
  __n = 2;
  if (2 < uVar8) {
    __n = (size_type)uVar8;
  }
  local_68 = context->m_platformInterface;
  local_60 = Context::getDeviceInterface(context);
  local_58 = Context::getDevice(context);
  local_50 = Context::getUniversalQueueFamilyIndex(context);
  local_48 = context->m_progCollection;
  local_40 = 0;
  local_38 = 1;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  ::vector(&local_b0,__n,__a);
  ThreadGroup::ThreadGroup(&local_98);
  lVar9 = 0;
  do {
    pvVar6 = operator_new(1);
    plVar7 = (long *)operator_new(0x20);
    pSVar4 = local_b0.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar7 + 1) = 0;
    *(undefined4 *)((long)plVar7 + 0xc) = 0;
    *plVar7 = (long)&PTR__SharedPtrState_00d52bf0;
    plVar7[2] = (long)pvVar6;
    *(undefined4 *)(plVar7 + 1) = 1;
    *(undefined4 *)((long)plVar7 + 0xc) = 1;
    plVar2 = *(long **)((long)&(local_b0.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar9);
    if (plVar2 != plVar7) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)
           ((long)&(local_b0.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9) = 0;
          (**(code **)(**(long **)((long)&(local_b0.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar9) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar4->m_state + lVar9) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          plVar2 = *(long **)((long)&pSVar4->m_state + lVar9);
          if (plVar2 != (long *)0x0) {
            (**(code **)(*plVar2 + 8))();
          }
          *(undefined8 *)((long)&pSVar4->m_state + lVar9) = 0;
        }
      }
      *(void **)((long)&pSVar4->m_ptr + lVar9) = pvVar6;
      *(long **)((long)&pSVar4->m_state + lVar9) = plVar7;
      LOCK();
      *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
      UNLOCK();
      LOCK();
      piVar1 = (int *)(*(long *)((long)&pSVar4->m_state + lVar9) + 0xc);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar7 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar7 + 0x10))(plVar7);
    }
    LOCK();
    piVar1 = (int *)((long)plVar7 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar7 + 8))(plVar7);
    }
    this = (ThreadGroupThread *)operator_new(0x88);
    uVar3 = *(undefined8 *)
             ((long)&(local_b0.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9);
    ThreadGroupThread::ThreadGroupThread(this);
    (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d52c30;
    this[1].super_Thread._vptr_Thread = (_func_int **)&local_68;
    *(undefined8 *)&this[1].super_Thread.m_attribs = uVar3;
    this[1].super_Thread.m_thread = (deThread)&local_c1;
    local_c0.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this;
    ThreadGroup::add(&local_98,&local_c0);
    if (local_c0.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_c0.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_c0.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    lVar9 = lVar9 + 0x10;
  } while (__n << 4 != lVar9);
  ThreadGroup::run(__return_storage_ptr__,&local_98);
  de::SpinBarrier::~SpinBarrier(&local_98.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_98.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  ::~vector(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}